

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall S2BooleanOperation::Impl::Build(Impl *this,S2Error *error)

{
  S2BooleanOperation *pSVar1;
  S2Builder *pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  S2Error *error_00;
  pointer *__ptr;
  Graph *g;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_c8;
  S2Builder *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  Options local_98;
  undefined1 local_88;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  code *local_40;
  undefined8 uStack_38;
  
  error->code_ = OK;
  (error->text_)._M_string_length = 0;
  *(error->text_)._M_dataplus._M_p = '\0';
  pSVar1 = this->op_;
  if (pSVar1->result_empty_ == (bool *)0x0) {
    S2Builder::Options::Options
              (&local_98,
               (SnapFunction *)
               (pSVar1->options_).snap_function_._M_t.
               super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
               ._M_t.
               super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
               .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>);
    uVar3 = local_98._8_8_;
    local_98.split_crossing_edges_ = true;
    uVar4 = local_98._8_8_;
    local_98._11_5_ = SUB85(uVar3,3);
    local_98._8_2_ = SUB82(uVar4,0);
    local_98.idempotent_ = false;
    absl::make_unique<S2Builder,S2Builder::Options&>((absl *)&local_c0,&local_98);
    pSVar2 = local_c0;
    local_c0 = (S2Builder *)0x0;
    std::__uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>::reset
              ((__uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_> *)&this->builder_,pSVar2
              );
    pSVar2 = local_c0;
    if (local_c0 != (S2Builder *)0x0) {
      S2Builder::~S2Builder(local_c0);
      operator_delete(pSVar2);
    }
    pSVar1 = this->op_;
    pSVar2 = (this->builder_)._M_t.super___uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>
             ._M_t.super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
             super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl;
    local_c8._M_head_impl = (Layer *)operator_new(0x20);
    (local_c8._M_head_impl)->_vptr_Layer = (_func_int **)&PTR__Layer_002bb238;
    local_c8._M_head_impl[1]._vptr_Layer = (_func_int **)&pSVar1->layers_;
    local_c8._M_head_impl[2]._vptr_Layer = (_func_int **)&this->input_dimensions_;
    local_c8._M_head_impl[3]._vptr_Layer = (_func_int **)&this->input_crossings_;
    S2Builder::StartLayer
              (pSVar2,(unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)
                      &local_c8);
    if (local_c8._M_head_impl != (Layer *)0x0) {
      (*(local_c8._M_head_impl)->_vptr_Layer[1])();
    }
    local_c8._M_head_impl = (Layer *)0x0;
    local_b8._8_8_ = 0;
    local_a0 = std::
               _Function_handler<bool_(const_S2Builder::Graph_&,_S2Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:2255:7)>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<bool_(const_S2Builder::Graph_&,_S2Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:2255:7)>
               ::_M_manager;
    local_b8._M_unused._M_object = this;
    S2Builder::AddIsFullPolygonPredicate
              ((this->builder_)._M_t.
               super___uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>._M_t.
               super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
               super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl,
               (IsFullPolygonPredicate *)&local_b8);
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
    }
    BuildOpType(this,this->op_->op_type_);
    bVar5 = S2Builder::Build((this->builder_)._M_t.
                             super___uniq_ptr_impl<S2Builder,_std::default_delete<S2Builder>_>._M_t.
                             super__Tuple_impl<0UL,_S2Builder_*,_std::default_delete<S2Builder>_>.
                             super__Head_base<0UL,_S2Builder_*,_false>._M_head_impl,error);
    if (local_98.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)0x0
       ) {
      (*(*(_func_int ***)
          local_98.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
    }
  }
  else {
    local_98.snap_function_._M_t.
    super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>.
    _M_t.
    super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
    .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl =
         (__uniq_ptr_data<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>,_true,_true>
          )(__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)
           0x200000000;
    local_98.split_crossing_edges_ = true;
    local_98.simplify_edge_chains_ = false;
    local_98.idempotent_ = false;
    local_98._11_5_ = 0x200;
    local_88 = 1;
    local_84 = 0xffffffff;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    local_60 = 0;
    uStack_58 = 0;
    local_50 = 0;
    uStack_48 = 0;
    local_40 = (code *)0x0;
    uStack_38 = 0;
    g = (Graph *)(ulong)pSVar1->op_type_;
    bVar5 = BuildOpType(this,pSVar1->op_type_);
    if (bVar5) {
      bVar5 = IsFullPolygonResult(this,g,error_00);
      *this->op_->result_empty_ = !bVar5;
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,3);
      }
    }
    else {
      *this->op_->result_empty_ = false;
    }
    bVar5 = true;
  }
  return bVar5;
}

Assistant:

bool S2BooleanOperation::Impl::Build(S2Error* error) {
  error->Clear();
  if (is_boolean_output()) {
    // BuildOpType() returns true if and only if the result has no edges.
    S2Builder::Graph g;  // Unused by IsFullPolygonResult() implementation.
    *op_->result_empty_ =
        BuildOpType(op_->op_type()) && !IsFullPolygonResult(g, error);
    return true;
  }
  // TODO(ericv): Rather than having S2Builder split the edges, it would be
  // faster to call AddVertex() in this class and have a new S2Builder
  // option that increases the edge_snap_radius_ to account for errors in
  // the intersection point (the way that split_crossing_edges does).
  S2Builder::Options options(op_->options_.snap_function());
  options.set_split_crossing_edges(true);

  // TODO(ericv): Ideally idempotent() should be true, but existing clients
  // expect vertices closer than the full "snap_radius" to be snapped.
  options.set_idempotent(false);
  builder_ = make_unique<S2Builder>(options);
  builder_->StartLayer(make_unique<EdgeClippingLayer>(
      &op_->layers_, &input_dimensions_, &input_crossings_));

  // Add a predicate that decides whether a result with no polygon edges should
  // be interpreted as the empty polygon or the full polygon.
  builder_->AddIsFullPolygonPredicate(
      [this](const S2Builder::Graph& g, S2Error* error) {
        return IsFullPolygonResult(g, error);
      });
  (void) BuildOpType(op_->op_type());
  return builder_->Build(error);
}